

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

void __thiscall AixLog::Log::~Log(Log *this)

{
  Log *in_RDI;
  
  ~Log(in_RDI);
  operator_delete(in_RDI,0x170);
  return;
}

Assistant:

virtual ~Log() { sync(); }